

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execNbcd<(moira::Instr)82,(moira::Mode)6,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 in_EAX;
  u32 val;
  u32 in_register_00000004;
  u32 data;
  u32 ea;
  u32 local_18;
  u32 local_14;
  
  local_18 = in_EAX;
  local_14 = in_register_00000004;
  bVar1 = readOp<(moira::Mode)6,(moira::Size)1,0ul>(this,opcode & 7,&local_14,&local_18);
  if (bVar1) {
    prefetch<0ul>(this);
    val = bcd<(moira::Instr)100,(moira::Size)1>(this,local_18,0);
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_14,val);
  }
  return;
}

Assistant:

void
Moira::execNbcd(u16 opcode)
{
    int reg = _____________xxx(opcode);

    switch (M) {

        case 0: // Dn
        {
            prefetch<POLLIPL>();

            sync(2);
            writeD<Byte>(reg, bcd<SBCD, Byte>(readD<Byte>(reg), 0));
            break;
        }
        default: // Ea
        {
            u32 ea, data;
            if (!readOp<M, Byte>(reg, ea, data)) return;
            prefetch();
            writeM<M, Byte, POLLIPL>(ea, bcd <SBCD,Byte> (data, 0));
            break;
        }
    }
}